

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintFieldName
          (FieldValuePrinterWrapper *this,Message *message,int param_2,int param_3,
          Reflection *reflection,FieldDescriptor *field,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_50;
  FieldDescriptor *local_30;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  int param_3_local;
  int param_2_local;
  Message *message_local;
  FieldValuePrinterWrapper *this_local;
  
  local_30 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local._0_4_ = param_3;
  reflection_local._4_4_ = param_2;
  _param_3_local = message;
  message_local = (Message *)this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[0xc])(&local_50,pFVar1,_param_3_local,field_local,local_30);
  TextFormat::BaseTextGenerator::PrintString(generator,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void PrintFieldName(const Message& message, int /*field_index*/,
                      int /*field_count*/, const Reflection* reflection,
                      const FieldDescriptor* field,
                      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(
        delegate_->PrintFieldName(message, reflection, field));
  }